

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxBitOp::Emit(FxBitOp *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  int iVar2;
  uint uVar3;
  uint extraout_var;
  uint extraout_var_00;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ExpEmit EVar8;
  ulong local_38;
  
  pFVar1 = (this->super_FxBinary).left;
  if (pFVar1->ValueType->RegType != '\0') {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5e,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  if (((this->super_FxBinary).right)->ValueType->RegType != '\0') {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5f,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  iVar2 = (*pFVar1->_vptr_FxExpression[9])();
  local_38 = CONCAT44(extraout_var,iVar2);
  uVar3 = extraout_var >> 8;
  pFVar1 = (this->super_FxBinary).right;
  iVar2 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  uVar5 = CONCAT44(extraout_var_00,iVar2);
  uVar6 = extraout_var_00;
  uVar4 = extraout_var;
  uVar7 = extraout_var_00 >> 8;
  if ((extraout_var & 1) != 0) {
    uVar5 = local_38;
    local_38 = CONCAT44(extraout_var_00,iVar2);
    uVar6 = extraout_var;
    uVar4 = extraout_var_00;
    uVar7 = uVar3;
    uVar3 = extraout_var_00 >> 8;
  }
  if ((uVar4 & 1) != 0) {
    __assert_fail("!op1.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe69,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  if ((((uVar7 & 1) == 0) && ((uVar6 & 1) == 0)) && ((uVar5 & 0xfc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(uVar5 >> 0x10) & 3),(uint)uVar5 & 0xffff,
               (uint)(uVar5 >> 0x18) & 0xff);
  }
  if (((uVar3 & 1) == 0) && ((local_38 & 0xfc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(local_38 >> 0x10) & 3),(uint)local_38 & 0xffff,
               (uint)(local_38 >> 0x18) & 0xff);
  }
  iVar2 = (this->super_FxBinary).Operator;
  if (iVar2 == 0x26) {
    iVar2 = 0x77;
  }
  else if (iVar2 == 0x5e) {
    iVar2 = 0x7b;
  }
  else {
    if (iVar2 != 0x7c) {
      __assert_fail("instr > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xe72,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
    }
    iVar2 = 0x79;
  }
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  VMFunctionBuilder::Emit
            (build,(uVar6 & 0xff) + iVar2,uVar3 & 0xffff,(uint)local_38 & 0xffff,
             (uint)uVar5 & 0xffff);
  EVar8._0_4_ = uVar3 & 0xffff | 0x1000000;
  EVar8.Konst = false;
  EVar8.Fixed = false;
  EVar8.Final = false;
  EVar8.Target = false;
  return EVar8;
}

Assistant:

ExpEmit FxBitOp::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	int instr, rop;
	ExpEmit op1, op2;

	op1 = left->Emit(build);
	op2 = right->Emit(build);
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);
	rop = op2.RegNum;
	op2.Free(build);
	op1.Free(build);

	instr = Operator == '&' ? OP_AND_RR :
			Operator == '|' ? OP_OR_RR :
			Operator == '^' ? OP_XOR_RR : -1;

	assert(instr > 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr + op2.Konst, to.RegNum, op1.RegNum, rop);
	return to;
}